

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxDebug.cpp
# Opt level: O0

void Diligent::LinuxDebug::AssertionFailed(Char *Message,char *Function,char *File,int Line)

{
  undefined *puVar1;
  bool bVar2;
  undefined8 uVar3;
  Char *Message_00;
  int in_R9D;
  undefined1 local_48 [8];
  String AssertionFailedMessage;
  int Line_local;
  char *File_local;
  char *Function_local;
  Char *Message_local;
  
  AssertionFailedMessage.field_2._12_4_ = Line;
  BasicPlatformDebug::FormatAssertionFailedMessage_abi_cxx11_
            ((String *)local_48,(BasicPlatformDebug *)Message,Function,File,
             (char *)(ulong)(uint)Line,in_R9D);
  puVar1 = DebugMessageCallback;
  if (DebugMessageCallback == (undefined *)0x0) {
    Message_00 = (Char *)std::__cxx11::string::c_str();
    OutputDebugMessage(DEBUG_MESSAGE_SEVERITY_ERROR,Message_00,(char *)0x0,(char *)0x0,0,Auto);
  }
  else {
    uVar3 = std::__cxx11::string::c_str();
    (*(code *)puVar1)(2,uVar3,0);
  }
  bVar2 = BasicPlatformDebug::GetBreakOnError();
  if (bVar2) {
    raise(5);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void LinuxDebug::AssertionFailed(const Char* Message, const char* Function, const char* File, int Line)
{
    String AssertionFailedMessage = FormatAssertionFailedMessage(Message, Function, File, Line);
    if (DebugMessageCallback)
    {
        DebugMessageCallback(DEBUG_MESSAGE_SEVERITY_ERROR, AssertionFailedMessage.c_str(), nullptr, nullptr, 0);
    }
    else
    {
        OutputDebugMessage(DEBUG_MESSAGE_SEVERITY_ERROR, AssertionFailedMessage.c_str(), nullptr, nullptr, 0);
    }

    if (GetBreakOnError())
    {
        raise(SIGTRAP);
    }
}